

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char * stb_substr(char *t,int n)

{
  size_t sVar1;
  char *__dest;
  int z;
  char *a;
  int n_local;
  char *t_local;
  
  sVar1 = strlen(t);
  a._4_4_ = n;
  if ((int)sVar1 < n) {
    a._4_4_ = (int)sVar1;
  }
  __dest = (char *)malloc((long)(a._4_4_ + 1));
  strncpy(__dest,t,(long)a._4_4_);
  __dest[a._4_4_] = '\0';
  return __dest;
}

Assistant:

char *stb_substr(char *t, int n)
{
   char *a;
   int z = (int) strlen(t);
   if (z < n) n = z;
   a = (char *) malloc(n+1);
   strncpy(a,t,n);
   a[n] = 0;
   return a;
}